

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * pugi::impl::anon_unknown_0::integer_to_string<unsigned_long>
                   (char_t *begin,char_t *end,unsigned_long value,bool negative)

{
  undefined1 auVar1 [16];
  char_t *pcVar2;
  unsigned_long local_40;
  unsigned_long local_38;
  unsigned_long rest;
  char_t *result;
  bool negative_local;
  unsigned_long value_local;
  char_t *end_local;
  char_t *begin_local;
  
  local_40 = value;
  if (negative) {
    local_40 = -value;
  }
  local_38 = local_40;
  rest = (unsigned_long)(end + -1);
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_38;
    pcVar2 = (char_t *)(rest - 1);
    *(char *)rest = SUB161(auVar1 % ZEXT816(10),0) + '0';
    local_38 = local_38 / 10;
    rest = (unsigned_long)pcVar2;
  } while (local_38 != 0);
  if (pcVar2 < begin) {
    __assert_fail("result >= begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/external/pugixml.cpp"
                  ,0x1240,
                  "char_t *pugi::impl::(anonymous namespace)::integer_to_string(char_t *, char_t *, U, bool) [U = unsigned long]"
                 );
  }
  *pcVar2 = '-';
  return pcVar2 + (int)(uint)((negative ^ 0xffU) & 1);
}

Assistant:

PUGI_IMPL_FN PUGI_IMPL_UNSIGNED_OVERFLOW char_t* integer_to_string(char_t* begin, char_t* end, U value, bool negative)
	{
		char_t* result = end - 1;
		U rest = negative ? 0 - value : value;

		do
		{
			*result-- = static_cast<char_t>('0' + (rest % 10));
			rest /= 10;
		}
		while (rest);

		assert(result >= begin);
		(void)begin;

		*result = '-';

		return result + !negative;
	}